

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_fputcsv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  io_private *piVar1;
  jx9_io_stream *pjVar2;
  char *pcVar3;
  jx9_value *pArray;
  int n;
  csv_data sCsv;
  
  if (((nArg < 2) || (((*apArg)->iFlags & 0x100) == 0)) ||
     (pArray = apArg[1], (pArray->iFlags & 0x40) == 0)) {
    pcVar3 = "Missing/Invalid arguments";
  }
  else {
    piVar1 = (io_private *)((*apArg)->x).pOther;
    if ((piVar1 != (io_private *)0x0) && (piVar1->iMagic == 0xfeac14)) {
      pjVar2 = piVar1->pStream;
      if (pjVar2 == (jx9_io_stream *)0x0) {
        pcVar3 = "null_stream";
      }
      else {
        if (pjVar2->xWrite != (_func_jx9_int64_void_ptr_void_ptr_jx9_int64 *)0x0) {
          sCsv.delimiter = 0x2c;
          sCsv.enclosure = 0x22;
          sCsv.iCount = 0;
          sCsv.pDev = piVar1;
          if (nArg != 2) {
            pcVar3 = jx9_value_to_string(apArg[2],&n);
            if (0 < n) {
              sCsv.delimiter = (int)*pcVar3;
            }
            if ((3 < (uint)nArg) && (pcVar3 = jx9_value_to_string(apArg[3],&n), 0 < n)) {
              sCsv.enclosure = (int)*pcVar3;
            }
            pArray = apArg[1];
          }
          jx9_array_walk(pArray,csv_write_callback,&sCsv);
          (*piVar1->pStream->xWrite)(piVar1->pHandle,"\n",1);
          return 0;
        }
        pcVar3 = pjVar2->zName;
      }
      jx9_context_throw_error_format
                (pCtx,2,
                 "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                 ,(pCtx->pFunc->sName).zString,pcVar3);
      goto LAB_001369e4;
    }
    pcVar3 = "Expecting an IO handle";
  }
  jx9_context_throw_error(pCtx,2,pcVar3);
LAB_001369e4:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_fputcsv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	struct csv_data sCsv;
	io_private *pDev;
	char *zEol;
	int eolen;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Missing/Invalid arguments");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xWrite == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set default csv separator */
	sCsv.delimiter = ',';
	sCsv.enclosure = '"';
	sCsv.pDev = pDev;
	sCsv.iCount = 0;
	if( nArg > 2 ){
		/* User delimiter */
		const char *z;
		int n;
		z = jx9_value_to_string(apArg[2], &n);
		if( n > 0 ){
			sCsv.delimiter = z[0];
		}
		if( nArg > 3 ){
			z = jx9_value_to_string(apArg[3], &n);
			if( n > 0 ){
				sCsv.enclosure = z[0];
			}
		}
	}
	/* Iterate throw array entries and write csv data */
	jx9_array_walk(apArg[1], csv_write_callback, &sCsv);
	/* Write a line ending */
#ifdef __WINNT__
	zEol = "\r\n";
	eolen = (int)sizeof("\r\n")-1;
#else
	/* Assume UNIX LF */
	zEol = "\n";
	eolen = (int)sizeof(char);
#endif
	pDev->pStream->xWrite(pDev->pHandle, (const void *)zEol, eolen);
	return JX9_OK;
}